

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O3

SphereTree *
sphere_hierarchy(SphereTree *__return_storage_ptr__,vector<Sphere,_std::allocator<Sphere>_> *spheres
                )

{
  vector<SphereTree,_std::allocator<SphereTree>_> *this;
  undefined8 *puVar1;
  float fVar2;
  pointer pSVar3;
  pointer pSVar4;
  undefined8 uVar5;
  invalid_argument *this_00;
  SphereTree *pSVar6;
  SphereTree *p;
  ulong uVar7;
  SphereTree *pSVar8;
  pointer pSVar9;
  long lVar10;
  SphereTree *pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  uint uVar14;
  data_t dVar15;
  float fVar16;
  float fVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  Sphere SVar23;
  vector<SphereTree,_std::allocator<SphereTree>_> nodes;
  vector<SphereTree,_std::allocator<SphereTree>_> parents;
  SphereTree o;
  float local_f0;
  float local_ec;
  vector<SphereTree,_std::allocator<SphereTree>_> local_e8;
  vector<SphereTree,_std::allocator<SphereTree>_> local_c8;
  SphereTree local_a8;
  SphereTree *local_80;
  vec3f local_78;
  float fStack_6c;
  vector<SphereTree,_std::allocator<SphereTree>_> local_68;
  vector<Sphere,_std::allocator<Sphere>_> local_48;
  
  local_80 = __return_storage_ptr__;
  github111116::ConsoleLogger::log<char[29]>(&console,(char (*) [29])"building sphere hierarchy...")
  ;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_start = (SphereTree *)0x0;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_finish = (SphereTree *)0x0;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar9 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar9 != pSVar3) {
    do {
      local_a8.bound.center.x = (pSVar9->center).x;
      local_a8.bound.center.y = (pSVar9->center).y;
      local_a8.bound._8_8_ = *(undefined8 *)&(pSVar9->center).z;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>
                (&local_e8,&local_a8);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != pSVar3);
  }
  if (1 < (ulong)(((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    this = &local_a8.child;
    do {
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>>
                ((__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                  )local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                  )local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start = (SphereTree *)0x0;
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (SphereTree *)0x0;
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar7 = 0xffffffffffffffff;
      lVar10 = 8;
      do {
        puVar1 = (undefined8 *)
                 ((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar10 + -8);
        local_a8.bound.center._0_8_ = *puVar1;
        local_a8.bound._8_8_ = puVar1[1];
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>
                  (&local_c8,&local_a8);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
        uVar7 = uVar7 + 1;
        lVar10 = lVar10 + 0x28;
      } while (uVar7 < ((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
                       1U >> 2);
      local_ec = 1e+18;
      pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar11 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        for (; pSVar4 = local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                        .super__Vector_impl_data._M_finish, pSVar6 != pSVar11; pSVar6 = pSVar6 + 1)
        {
          pSVar4 = (pSVar6->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar12 = (pSVar6->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pSVar13 = pSVar4;
          if (pSVar12 != pSVar4) {
            do {
              std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&pSVar13->child);
              pSVar13 = pSVar13 + 1;
            } while (pSVar13 != pSVar12);
            (pSVar6->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar4;
          }
        }
        pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar8 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pSVar11 = local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_start = pSVar6,
            local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar8, pSVar11 != pSVar4; pSVar11 = pSVar11 + 1) {
          local_a8.bound.center.x = (pSVar11->bound).center.x;
          local_a8.bound.center.y = (pSVar11->bound).center.y;
          local_a8.bound._8_8_ = *(undefined8 *)&(pSVar11->bound).center.z;
          std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(this,&pSVar11->child);
          local_78.x = local_a8.bound.center.x;
          local_78.y = local_a8.bound.center.y;
          local_78.z = local_a8.bound.center.z;
          fStack_6c = local_a8.bound.radius;
          std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(&local_68,this);
          if (local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"empty container is not allowed.");
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          pSVar8 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pSVar6 != local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                        .super__Vector_impl_data._M_finish) {
            dVar15 = ((local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_start)->bound).center.x;
            do {
              fVar2 = (pSVar6->bound).center.x;
              fVar22 = fVar2 - local_78.x;
              fVar16 = (pSVar6->bound).center.y - local_78.y;
              fVar19 = (pSVar8->bound).center.y - local_78.y;
              fVar20 = (pSVar6->bound).center.z - local_78.z;
              fVar21 = (pSVar8->bound).center.z - local_78.z;
              auVar17._0_4_ = fVar16 * fVar16;
              auVar17._4_4_ = fVar19 * fVar19;
              auVar17._8_4_ = (0.0 - local_78.y) * (0.0 - local_78.y);
              auVar17._12_4_ = (0.0 - local_78.y) * (0.0 - local_78.y);
              auVar18._4_4_ =
                   fVar21 * fVar21 + (dVar15 - local_78.x) * (dVar15 - local_78.x) + auVar17._4_4_;
              auVar18._0_4_ = fVar20 * fVar20 + fVar22 * fVar22 + auVar17._0_4_;
              auVar18._8_4_ =
                   (0.0 - local_78.z) * (0.0 - local_78.z) +
                   (0.0 - local_78.x) * (0.0 - local_78.x) + auVar17._8_4_;
              auVar18._12_4_ =
                   (0.0 - local_78.z) * (0.0 - local_78.z) +
                   (0.0 - local_78.x) * (0.0 - local_78.x) + auVar17._12_4_;
              auVar18 = sqrtps(auVar17,auVar18);
              uVar14 = -(uint)(auVar18._0_4_ < auVar18._4_4_);
              if (auVar18._0_4_ < auVar18._4_4_) {
                pSVar8 = pSVar6;
              }
              dVar15 = (data_t)(~uVar14 & (uint)dVar15 | (uint)fVar2 & uVar14);
              pSVar6 = pSVar6 + 1;
            } while (pSVar6 != local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          }
          std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back(&pSVar8->child,&local_a8);
          std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_68);
          std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(this);
          pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar8 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        local_f0 = 0.0;
        if (pSVar6 != pSVar8) {
          do {
            sphere_tree_leaves(&local_48,pSVar6);
            SVar23 = sphere_set_bounding_sphere(&local_48);
            pSVar6->bound = SVar23;
            if (local_48.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            pSVar4 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pSVar6 = pSVar6 + 1;
          } while (pSVar6 != pSVar8);
          if (local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_f0 = 0.0;
            pSVar12 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              local_a8.bound.center.x = (pSVar12->bound).center.x;
              local_a8.bound.center.y = (pSVar12->bound).center.y;
              local_a8.bound._8_8_ = *(undefined8 *)&(pSVar12->bound).center.z;
              std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
                        (&local_a8.child,&pSVar12->child);
              local_f0 = local_f0 + local_a8.bound.radius;
              std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
              pSVar12 = pSVar12 + 1;
            } while (pSVar12 != pSVar4);
          }
        }
        if (local_ec < local_f0) {
          github111116::ConsoleLogger::debug<char[35]>
                    (&console,(char (*) [35])"sphere clustering: loss increasing");
        }
        fVar2 = local_ec + -1e-05;
        pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar11 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_ec = local_f0;
      } while (local_f0 <= fVar2);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::operator=(&local_e8,&local_c8);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_c8);
    } while (1 < (ulong)(((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x3333333333333333));
  }
  pSVar11 = local_80;
  dVar15 = ((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_start)->bound).center.y;
  uVar5 = *(undefined8 *)
           &((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_start)->bound).center.z;
  (local_80->bound).center.x =
       ((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
         super__Vector_impl_data._M_start)->bound).center.x;
  (local_80->bound).center.y = dVar15;
  *(undefined8 *)&(local_80->bound).center.z = uVar5;
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
            (&local_80->child,
             &(local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start)->child);
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_e8);
  return pSVar11;
}

Assistant:

SphereTree sphere_hierarchy(std::vector<Sphere> spheres)
{
	console.log("building sphere hierarchy...");
	// build leaf nodes
	std::vector<SphereTree> nodes;
	for (auto s: spheres)
		nodes.push_back(SphereTree(s));
	// successively form next layer
	while (nodes.size() > 1) {
		// randomly select representatives
		std::random_shuffle(nodes.begin(), nodes.end());
		std::vector<SphereTree> parents;
		for (int i=0; i<(nodes.size()-1)/4+1; ++i)
			parents.push_back(SphereTree(nodes[i].bound));
		// iteratively assign & optimize
		float lastloss = 1e18;
		while (true) {
			// stage 1. assign
			for (auto& p: parents)
				p.child.clear();
			for (auto o: nodes)
				argmin(parents, [o](const SphereTree& t){return norm(t.bound.center - o.bound.center);})->child.push_back(o);
			// state 2. optimize
			for (auto& p: parents)
				p.bound = sphere_set_bounding_sphere(sphere_tree_leaves(p));
			// calculate total loss
			float curloss = 0;
			for (auto p: parents)
				curloss += p.bound.radius;
			if (curloss > lastloss)
				console.debug("sphere clustering: loss increasing");
			if (curloss > lastloss - 1e-5)
				break;
			lastloss = curloss;
		}
		nodes = parents;
	}
	return nodes[0];
}